

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O3

void Fraig_NodeTransferFanout(Fraig_Node_t *pNodeFrom,Fraig_Node_t *pNodeTo)

{
  Fraig_Node_t *pFVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t **ppFVar4;
  
  if (pNodeTo->pFanPivot != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanPivot == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x85,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (pNodeTo->pFanFanin1 != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanFanin1 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x86,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (pNodeTo->pFanFanin2 != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanFanin2 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x87,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  pFVar1 = pNodeFrom->pFanPivot;
  if (pFVar1 == (Fraig_Node_t *)0x0) {
    pFVar1 = (Fraig_Node_t *)0x0;
  }
  else {
    do {
      pFVar3 = pFVar1->p1;
      pFVar2 = (Fraig_Node_t *)((ulong)pFVar3 & 0xfffffffffffffffe);
      if (pFVar2 == pNodeFrom) {
        ppFVar4 = &pFVar1->p1;
        pFVar2 = (Fraig_Node_t *)((ulong)pNodeTo & 0xfffffffffffffffe);
LAB_005ee93a:
        *ppFVar4 = (Fraig_Node_t *)((ulong)((uint)pFVar3 & 1) ^ (ulong)pNodeTo);
      }
      else {
        pFVar3 = pFVar1->p2;
        if ((Fraig_Node_t *)((ulong)pFVar3 & 0xfffffffffffffffe) == pNodeFrom) {
          ppFVar4 = &pFVar1->p2;
          goto LAB_005ee93a;
        }
      }
      pFVar1 = (&pFVar1->pFanFanin1)[pFVar2 != pNodeFrom];
    } while (pFVar1 != (Fraig_Node_t *)0x0);
    pFVar1 = pNodeFrom->pFanPivot;
  }
  pNodeTo->pFanPivot = pFVar1;
  pFVar1 = pNodeFrom->pFanFanin2;
  pNodeTo->pFanFanin1 = pNodeFrom->pFanFanin1;
  pNodeTo->pFanFanin2 = pFVar1;
  pNodeFrom->pFanPivot = (Fraig_Node_t *)0x0;
  pNodeFrom->pFanFanin1 = (Fraig_Node_t *)0x0;
  pNodeFrom->pFanFanin2 = (Fraig_Node_t *)0x0;
  return;
}

Assistant:

void Fraig_NodeTransferFanout( Fraig_Node_t * pNodeFrom, Fraig_Node_t * pNodeTo )
{
    Fraig_Node_t * pFanout;
    assert( pNodeTo->pFanPivot == NULL );
    assert( pNodeTo->pFanFanin1 == NULL );
    assert( pNodeTo->pFanFanin2 == NULL );
    // go through the fanouts and update their fanins
    Fraig_NodeForEachFanout( pNodeFrom, pFanout )
    {
        if ( Fraig_Regular(pFanout->p1) == pNodeFrom )
            pFanout->p1 = Fraig_NotCond( pNodeTo, Fraig_IsComplement(pFanout->p1) );
        else if ( Fraig_Regular(pFanout->p2) == pNodeFrom )
            pFanout->p2 = Fraig_NotCond( pNodeTo, Fraig_IsComplement(pFanout->p2) );            
    }
    // move the pointers
    pNodeTo->pFanPivot  = pNodeFrom->pFanPivot;  
    pNodeTo->pFanFanin1 = pNodeFrom->pFanFanin1; 
    pNodeTo->pFanFanin2 = pNodeFrom->pFanFanin2;
    pNodeFrom->pFanPivot  = NULL; 
    pNodeFrom->pFanFanin1 = NULL; 
    pNodeFrom->pFanFanin2 = NULL;  
}